

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int is_stateless_reset(quicly_conn_t *conn,quicly_decoded_packet_t *decoded)

{
  quicly_decoded_packet_t *decoded_local;
  quicly_conn_t *conn_local;
  int local_4;
  
  if (decoded->_is_stateless_reset_cached == QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET) {
    local_4 = 1;
  }
  else if (decoded->_is_stateless_reset_cached == QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET)
  {
    local_4 = 0;
  }
  else if ((conn->super).remote.cid_set.cids[0].is_active == 0) {
    local_4 = 0;
  }
  else if ((decoded->octets).len < 0x27) {
    local_4 = 0;
  }
  else if (*(undefined1 (*) [16])((decoded->octets).base + ((decoded->octets).len - 0x10)) ==
           *(undefined1 (*) [16])(conn->super).remote.cid_set.cids[0].stateless_reset_token) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int is_stateless_reset(quicly_conn_t *conn, quicly_decoded_packet_t *decoded)
{
    switch (decoded->_is_stateless_reset_cached) {
    case QUICLY__DECODED_PACKET_CACHED_IS_STATELESS_RESET:
        return 1;
    case QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET:
        return 0;
    default:
        break;
    }

    if (!conn->super.remote.cid_set.cids[0].is_active)
        return 0;
    if (decoded->octets.len < QUICLY_STATELESS_RESET_PACKET_MIN_LEN)
        return 0;
    if (memcmp(decoded->octets.base + decoded->octets.len - QUICLY_STATELESS_RESET_TOKEN_LEN,
               conn->super.remote.cid_set.cids[0].stateless_reset_token, QUICLY_STATELESS_RESET_TOKEN_LEN) != 0)
        return 0;

    return 1;
}